

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O0

size_t create_circuit(ect *e,uint64_t max_label,uint64_t eliminations)

{
  uint uVar1;
  uint uVar2;
  v_array<v_array<unsigned_int>_> tournaments_00;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  v_array<v_array<unsigned_int>_> *pvVar6;
  v_array<unsigned_int> *pvVar7;
  uint *puVar8;
  direction *pdVar9;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint32_t direction_index;
  direction d_1;
  uint32_t right;
  uint32_t left;
  uint32_t id;
  size_t j;
  size_t t_2;
  v_array<unsigned_int> empty;
  size_t t_1;
  v_array<v_array<unsigned_int>_> new_tournaments;
  uint32_t node;
  size_t level;
  size_t i_1;
  direction d;
  uint32_t i;
  v_array<unsigned_int> t;
  v_array<v_array<unsigned_int>_> tournaments;
  direction *in_stack_fffffffffffffe08;
  direction *new_ele;
  v_array<direction> *in_stack_fffffffffffffe10;
  v_array<direction> *this;
  ulong in_stack_fffffffffffffe30;
  long in_stack_fffffffffffffe38;
  ulong in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe4c;
  ulong local_140;
  ulong local_138;
  ulong local_110;
  v_array<v_array<unsigned_int>_> local_108;
  direction *local_e8;
  v_array<direction> *local_e0;
  v_array<unsigned_int> *local_d8;
  size_t local_d0;
  int local_c4;
  size_t local_c0;
  undefined1 local_b8 [32];
  ulong local_98;
  ulong local_90 [4];
  undefined1 local_70;
  uint local_64;
  v_array<v_array<unsigned_int>_> local_40;
  long local_20;
  ulong local_18;
  long local_10;
  size_t local_8;
  
  if (in_RSI == 1) {
    local_8 = 0;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    v_init<v_array<unsigned_int>>();
    v_init<unsigned_int>();
    for (local_64 = 0; local_64 < local_18; local_64 = local_64 + 1) {
      v_array<unsigned_int>::push_back
                ((v_array<unsigned_int> *)in_stack_fffffffffffffe10,
                 (uint *)in_stack_fffffffffffffe08);
      memset(local_90,0,0x28);
      local_90[0] = (ulong)local_64;
      local_70 = 0;
      v_array<direction>::push_back(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    }
    v_array<v_array<unsigned_int>_>::push_back
              ((v_array<v_array<unsigned_int>_> *)in_stack_fffffffffffffe10,
               (v_array<unsigned_int> *)in_stack_fffffffffffffe08);
    for (local_98 = 0; local_98 < local_20 - 1U; local_98 = local_98 + 1) {
      memset(local_b8,0,0x20);
      v_array<v_array<unsigned_int>_>::push_back
                ((v_array<v_array<unsigned_int>_> *)in_stack_fffffffffffffe10,
                 (v_array<unsigned_int> *)in_stack_fffffffffffffe08);
    }
    v_array<v_array<v_array<unsigned_int>_>_>::push_back
              ((v_array<v_array<v_array<unsigned_int>_>_> *)in_stack_fffffffffffffe10,
               (v_array<v_array<unsigned_int>_> *)in_stack_fffffffffffffe08);
    local_c0 = 0;
    sVar5 = v_array<direction>::size((v_array<direction> *)(local_10 + 0x18));
    local_c4 = (int)sVar5;
    while( true ) {
      pvVar6 = v_array<v_array<v_array<unsigned_int>_>_>::operator[]
                         ((v_array<v_array<v_array<unsigned_int>_>_> *)(local_10 + 0x38),local_c0);
      new_ele = (direction *)pvVar6->_begin;
      this = (v_array<direction> *)pvVar6->_end;
      local_d8 = pvVar6->end_array;
      local_d0 = pvVar6->erase_count;
      tournaments_00._end = (v_array<unsigned_int> *)in_stack_fffffffffffffe38;
      tournaments_00._begin = (v_array<unsigned_int> *)in_stack_fffffffffffffe30;
      tournaments_00.end_array = (v_array<unsigned_int> *)in_stack_fffffffffffffe40;
      tournaments_00.erase_count._0_4_ = in_stack_fffffffffffffe48;
      tournaments_00.erase_count._4_4_ = in_stack_fffffffffffffe4c;
      local_e8 = new_ele;
      local_e0 = this;
      bVar3 = not_empty(tournaments_00);
      if (!bVar3) break;
      v_init<v_array<unsigned_int>>();
      pvVar6 = v_array<v_array<v_array<unsigned_int>_>_>::operator[]
                         ((v_array<v_array<v_array<unsigned_int>_>_> *)(local_10 + 0x38),local_c0);
      local_40._begin = pvVar6->_begin;
      local_40._end = pvVar6->_end;
      local_40.end_array = pvVar6->end_array;
      local_40.erase_count = pvVar6->erase_count;
      local_110 = 0;
      while( true ) {
        sVar5 = v_array<v_array<unsigned_int>_>::size(&local_40);
        if (sVar5 <= local_110) break;
        v_init<unsigned_int>();
        v_array<v_array<unsigned_int>_>::push_back
                  ((v_array<v_array<unsigned_int>_> *)this,(v_array<unsigned_int> *)new_ele);
        local_110 = local_110 + 1;
      }
      local_138 = 0;
      while( true ) {
        sVar5 = v_array<v_array<unsigned_int>_>::size(&local_40);
        if (sVar5 <= local_138) break;
        local_140 = 0;
        while( true ) {
          pvVar7 = v_array<v_array<unsigned_int>_>::operator[](&local_40,local_138);
          sVar5 = v_array<unsigned_int>::size(pvVar7);
          if (sVar5 >> 1 <= local_140) break;
          local_c4 = local_c4 + 1;
          pvVar7 = v_array<v_array<unsigned_int>_>::operator[](&local_40,local_138);
          puVar8 = v_array<unsigned_int>::operator[](pvVar7,local_140 << 1);
          uVar1 = *puVar8;
          pvVar7 = v_array<v_array<unsigned_int>_>::operator[](&local_40,local_138);
          puVar8 = v_array<unsigned_int>::operator[](pvVar7,local_140 * 2 + 1);
          uVar2 = *puVar8;
          v_array<direction>::push_back(this,new_ele);
          sVar5 = v_array<direction>::size((v_array<direction> *)(local_10 + 0x18));
          uVar4 = (int)sVar5 - 1;
          pdVar9 = v_array<direction>::operator[]
                             ((v_array<direction> *)(local_10 + 0x18),(ulong)uVar1);
          if (pdVar9->tournament == local_138) {
            pdVar9 = v_array<direction>::operator[]
                               ((v_array<direction> *)(local_10 + 0x18),(ulong)uVar1);
            pdVar9->winner = uVar4;
          }
          else {
            pdVar9 = v_array<direction>::operator[]
                               ((v_array<direction> *)(local_10 + 0x18),(ulong)uVar1);
            pdVar9->loser = uVar4;
          }
          pdVar9 = v_array<direction>::operator[]
                             ((v_array<direction> *)(local_10 + 0x18),(ulong)uVar2);
          if (pdVar9->tournament == local_138) {
            pdVar9 = v_array<direction>::operator[]
                               ((v_array<direction> *)(local_10 + 0x18),(ulong)uVar2);
            pdVar9->winner = uVar4;
          }
          else {
            pdVar9 = v_array<direction>::operator[]
                               ((v_array<direction> *)(local_10 + 0x18),(ulong)uVar2);
            pdVar9->loser = uVar4;
          }
          pdVar9 = v_array<direction>::operator[]
                             ((v_array<direction> *)(local_10 + 0x18),(ulong)uVar1);
          if ((pdVar9->last & 1U) == 1) {
            in_stack_fffffffffffffe4c = uVar4;
            pdVar9 = v_array<direction>::operator[]
                               ((v_array<direction> *)(local_10 + 0x18),(ulong)uVar1);
            pdVar9->winner = in_stack_fffffffffffffe4c;
          }
          pvVar7 = v_array<v_array<unsigned_int>_>::operator[](&local_40,local_138);
          sVar5 = v_array<unsigned_int>::size(pvVar7);
          if (sVar5 == 2) {
            if (local_138 != 0) {
              pvVar7 = v_array<v_array<unsigned_int>_>::operator[](&local_40,local_138 - 1);
              sVar5 = v_array<unsigned_int>::size(pvVar7);
              if (sVar5 != 0) goto LAB_00384c1d;
            }
            pdVar9 = v_array<direction>::operator[]
                               ((v_array<direction> *)(local_10 + 0x18),(ulong)uVar4);
            pdVar9->last = true;
            in_stack_fffffffffffffe40 = local_138 + 1;
            sVar5 = v_array<v_array<unsigned_int>_>::size(&local_40);
            if (in_stack_fffffffffffffe40 < sVar5) {
              v_array<v_array<unsigned_int>_>::operator[](&local_108,local_138 + 1);
              v_array<unsigned_int>::push_back((v_array<unsigned_int> *)this,(uint *)new_ele);
            }
            else {
              pdVar9 = v_array<direction>::operator[]
                                 ((v_array<direction> *)(local_10 + 0x18),(ulong)uVar4);
              pdVar9->winner = 0;
            }
            in_stack_fffffffffffffe38 = local_10 + 0x58;
            v_array<direction>::size((v_array<direction> *)(local_10 + 0x18));
            v_array<unsigned_int>::push_back((v_array<unsigned_int> *)this,(uint *)new_ele);
          }
          else {
LAB_00384c1d:
            v_array<v_array<unsigned_int>_>::operator[](&local_108,local_138);
            v_array<unsigned_int>::push_back((v_array<unsigned_int> *)this,(uint *)new_ele);
          }
          in_stack_fffffffffffffe30 = local_138 + 1;
          sVar5 = v_array<v_array<unsigned_int>_>::size(&local_40);
          if (in_stack_fffffffffffffe30 < sVar5) {
            v_array<v_array<unsigned_int>_>::operator[](&local_108,local_138 + 1);
            v_array<unsigned_int>::push_back((v_array<unsigned_int> *)this,(uint *)new_ele);
          }
          else {
            pdVar9 = v_array<direction>::operator[]
                               ((v_array<direction> *)(local_10 + 0x18),(ulong)uVar4);
            pdVar9->loser = 0;
          }
          local_140 = local_140 + 1;
        }
        pvVar7 = v_array<v_array<unsigned_int>_>::operator[](&local_40,local_138);
        sVar5 = v_array<unsigned_int>::size(pvVar7);
        if ((sVar5 & 1) == 1) {
          v_array<v_array<unsigned_int>_>::operator[](&local_108,local_138);
          pvVar7 = v_array<v_array<unsigned_int>_>::operator[](&local_40,local_138);
          v_array<unsigned_int>::last(pvVar7);
          v_array<unsigned_int>::push_back((v_array<unsigned_int> *)this,(uint *)new_ele);
        }
        local_138 = local_138 + 1;
      }
      v_array<v_array<v_array<unsigned_int>_>_>::push_back
                ((v_array<v_array<v_array<unsigned_int>_>_> *)this,
                 (v_array<v_array<unsigned_int>_> *)new_ele);
      local_c0 = local_c0 + 1;
    }
    *(int *)(local_10 + 0xc0) = ((int)local_18 + -1) * (int)local_20;
    if (1 < local_18) {
      sVar5 = final_depth((size_t)new_ele);
      *(size_t *)(local_10 + 0xb8) = sVar5;
    }
    local_8 = (ulong)*(uint *)(local_10 + 0xc0) + local_20 + -1;
  }
  return local_8;
}

Assistant:

size_t create_circuit(ect& e, uint64_t max_label, uint64_t eliminations)
{
  if (max_label == 1)
    return 0;

  v_array<v_array<uint32_t>> tournaments = v_init<v_array<uint32_t>>();
  v_array<uint32_t> t = v_init<uint32_t>();

  for (uint32_t i = 0; i < max_label; i++)
  {
    t.push_back(i);
    direction d = {i, 0, 0, 0, 0, 0, false};
    e.directions.push_back(d);
  }

  tournaments.push_back(t);

  for (size_t i = 0; i < eliminations - 1; i++) tournaments.push_back(v_array<uint32_t>());

  e.all_levels.push_back(tournaments);

  size_t level = 0;

  uint32_t node = (uint32_t)e.directions.size();

  while (not_empty(e.all_levels[level]))
  {
    v_array<v_array<uint32_t>> new_tournaments = v_init<v_array<uint32_t>>();
    tournaments = e.all_levels[level];

    for (size_t t = 0; t < tournaments.size(); t++)
    {
      v_array<uint32_t> empty = v_init<uint32_t>();
      new_tournaments.push_back(empty);
    }

    for (size_t t = 0; t < tournaments.size(); t++)
    {
      for (size_t j = 0; j < tournaments[t].size() / 2; j++)
      {
        uint32_t id = node++;
        uint32_t left = tournaments[t][2 * j];
        uint32_t right = tournaments[t][2 * j + 1];

        direction d = {id, t, 0, 0, left, right, false};
        e.directions.push_back(d);
        uint32_t direction_index = (uint32_t)e.directions.size() - 1;
        if (e.directions[left].tournament == t)
          e.directions[left].winner = direction_index;
        else
          e.directions[left].loser = direction_index;
        if (e.directions[right].tournament == t)
          e.directions[right].winner = direction_index;
        else
          e.directions[right].loser = direction_index;
        if (e.directions[left].last == true)
          e.directions[left].winner = direction_index;

        if (tournaments[t].size() == 2 && (t == 0 || tournaments[t - 1].size() == 0))
        {
          e.directions[direction_index].last = true;
          if (t + 1 < tournaments.size())
            new_tournaments[t + 1].push_back(id);
          else  // winner eliminated.
            e.directions[direction_index].winner = 0;
          e.final_nodes.push_back((uint32_t)(e.directions.size() - 1));
        }
        else
          new_tournaments[t].push_back(id);
        if (t + 1 < tournaments.size())
          new_tournaments[t + 1].push_back(id);
        else  // loser eliminated.
          e.directions[direction_index].loser = 0;
      }
      if (tournaments[t].size() % 2 == 1)
        new_tournaments[t].push_back(tournaments[t].last());
    }
    e.all_levels.push_back(new_tournaments);
    level++;
  }

  e.last_pair = (uint32_t)((max_label - 1) * eliminations);

  if (max_label > 1)
    e.tree_height = final_depth(eliminations);

  return e.last_pair + (eliminations - 1);
}